

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTPNMemArg::gen_code(CTPNMemArg *this,int discard,int param_3)

{
  uint uVar1;
  uint uVar2;
  CTcPrsNode *pCVar3;
  CTcPrsNode *pCVar4;
  CTPNArglistBase *this_00;
  uint in_ESI;
  CTPNMemArgBase *in_RDI;
  CTcNamedArgs named_args;
  int varargs;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined1 local_28 [20];
  uint local_14;
  uint local_c;
  
  local_c = in_ESI;
  CTPNMemArgBase::get_arg_list(in_RDI);
  CTPNArglist::gen_code_arglist
            ((CTPNArglist *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8,
             (CTcNamedArgs *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  pCVar3 = CTPNMemArgBase::get_obj_expr(in_RDI);
  pCVar4 = CTPNMemArgBase::get_prop_expr(in_RDI);
  uVar1 = (uint)(in_RDI->field_0x20 & 1);
  this_00 = &CTPNMemArgBase::get_arg_list(in_RDI)->super_CTPNArglistBase;
  uVar2 = CTPNArglistBase::get_argc(this_00);
  (*(pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x17])
            (pCVar3,(ulong)local_c,pCVar4,(ulong)uVar1,(ulong)uVar2,(ulong)local_14,local_28);
  return;
}

Assistant:

void CTPNMemArg::gen_code(int discard, int)
{
    /* push the argument list */
    int varargs;
    CTcNamedArgs named_args;
    get_arg_list()->gen_code_arglist(&varargs, named_args);

    /* ask the object expression to generate the code */
    get_obj_expr()->gen_code_member(discard, get_prop_expr(), prop_is_expr_,
                                    get_arg_list()->get_argc(),
                                    varargs, &named_args);
}